

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool QSslSocket::setActiveBackend(QString *backendName)

{
  bool bVar1;
  qsizetype qVar2;
  QListSpecialMethods<QString> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QMutexLocker<QMutex> locker;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffef8;
  CaseSensitivity in_stack_fffffffffffffefc;
  undefined2 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff02;
  byte in_stack_ffffffffffffff03;
  int in_stack_ffffffffffffff04;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  byte bVar3;
  QDebug *in_stack_ffffffffffffff18;
  QDebug local_c8 [2];
  char *in_stack_ffffffffffffff48;
  QDebug local_70;
  char local_68 [32];
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QString::size((QString *)in_RDI);
  if (qVar2 == 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffff04,
                        CONCAT13(in_stack_ffffffffffffff03,
                                 CONCAT12(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00))),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a3ca8);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (char *)in_RDI,in_stack_ffffffffffffff04,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (char *)0x3a3cc1);
      QMessageLogger::warning(local_68,"Invalid parameter (backend name cannot be an empty string)")
      ;
      local_10 = local_10 & 0xffffffffffffff00;
    }
    bVar3 = 0;
  }
  else {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)
               CONCAT44(in_stack_ffffffffffffff04,
                        CONCAT13(in_stack_ffffffffffffff03,
                                 CONCAT12(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00))),
               (QMutex *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (QSslSocketPrivate::tlsBackend == (QTlsBackend *)0x0) {
      QTlsBackend::availableBackendNames();
      bVar1 = QListSpecialMethods<QString>::contains
                        (in_RDI,(QString *)
                                CONCAT44(in_stack_ffffffffffffff04,
                                         CONCAT13(in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00))),
                         in_stack_fffffffffffffefc);
      in_stack_ffffffffffffff03 = bVar1 ^ 0xff;
      QList<QString>::~QList((QList<QString> *)0x3a3e64);
      if ((in_stack_ffffffffffffff03 & 1) == 0) {
        QString::operator=(&QSslSocketPrivate::activeBackendName,(QString *)in_RDI);
        bVar3 = 1;
      }
      else {
        local_48 = 0xaaaaaaaaaaaaaaaa;
        local_40 = 0xaaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcSsl();
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                   CONCAT44(in_stack_ffffffffffffff04,
                            CONCAT13(in_stack_ffffffffffffff03,
                                     CONCAT12(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00)))
                   ,(QLoggingCategory *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        while( true ) {
          bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_48);
          if (!bVar1) break;
          anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a3ec4);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                     ,(char *)in_RDI,in_stack_ffffffffffffff04,
                     (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (char *)0x3a3eda);
          QMessageLogger::warning();
          QDebug::operator<<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff48);
          QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                             ,(QString *)in_RDI);
          QDebug::operator<<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff48);
          QDebug::~QDebug(local_c8);
          local_40 = local_40 & 0xffffffffffffff00;
        }
        bVar3 = 0;
      }
    }
    else {
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT44(in_stack_ffffffffffffff04,
                          CONCAT13(in_stack_ffffffffffffff03,
                                   CONCAT12(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00))),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_38);
        if (!bVar1) break;
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a3d81);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   (char *)in_RDI,in_stack_ffffffffffffff04,
                   (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (char *)0x3a3d97);
        QMessageLogger::warning();
        QDebug::operator<<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff48);
        QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                           (QString *)in_RDI);
        QDebug::operator<<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff48);
        QDebug::~QDebug(&local_70);
        local_30 = local_30 & 0xffffffffffffff00;
      }
      QMutexLocker<QMutex>::unlock
                ((QMutexLocker<QMutex> *)
                 CONCAT44(in_stack_ffffffffffffff04,
                          CONCAT13(in_stack_ffffffffffffff03,
                                   CONCAT12(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00))));
      activeBackend();
      bVar3 = ::operator==((QString *)
                           CONCAT44(in_stack_ffffffffffffff04,
                                    CONCAT13(in_stack_ffffffffffffff03,
                                             CONCAT12(in_stack_ffffffffffffff02,
                                                      in_stack_ffffffffffffff00))),
                           (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
      ;
      QString::~QString((QString *)0x3a3e29);
    }
    QMutexLocker<QMutex>::~QMutexLocker
              ((QMutexLocker<QMutex> *)
               CONCAT44(1,CONCAT13(in_stack_ffffffffffffff03,
                                   CONCAT12(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00))));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::setActiveBackend(const QString &backendName)
{
    if (!backendName.size()) {
        qCWarning(lcSsl, "Invalid parameter (backend name cannot be an empty string)");
        return false;
    }

    QMutexLocker locker(&QSslSocketPrivate::backendMutex);
    if (QSslSocketPrivate::tlsBackend) {
        qCWarning(lcSsl) << "Cannot set backend named" << backendName
                         << "as active, another backend is already in use";
        locker.unlock();
        return activeBackend() == backendName;
    }

    if (!QTlsBackend::availableBackendNames().contains(backendName)) {
        qCWarning(lcSsl) << "Cannot set unavailable backend named" << backendName
                         << "as active";
        return false;
    }

    QSslSocketPrivate::activeBackendName = backendName;

    return true;
}